

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderPrimitiveCounterRestartingPrimitive::deinit
          (GeometryShaderPrimitiveCounterRestartingPrimitive *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_GeometryShaderPrimitiveCounter).super_TestCaseBase.m_context)->m_renderCtx
            ->_vptr_RenderContext[3])();
  if (this->m_bo_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  GeometryShaderPrimitiveCounter::deinit(&this->super_GeometryShaderPrimitiveCounter);
  return;
}

Assistant:

void GeometryShaderPrimitiveCounterRestartingPrimitive::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	/* Call base class' deinit() */
	GeometryShaderPrimitiveCounter::deinit();
}